

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbiw__jpg_processDU
              (stbi__write_context *s,int *bitBuf,int *bitCnt,float *CDU,int du_stride,float *fdtbl,
              int DC,unsigned_short (*HTDC) [2],unsigned_short (*HTAC) [2])

{
  int iVar1;
  long in_RCX;
  int in_R8D;
  long in_R9;
  bool bVar2;
  int in_stack_00000008;
  undefined2 *in_stack_00000018;
  int nrmarker;
  int lng;
  unsigned_short bits_1 [2];
  int nrzeroes;
  int startpos;
  unsigned_short bits [2];
  float v;
  int DU [64];
  int y;
  int x;
  int end0pos;
  int diff;
  int n;
  int j;
  int i;
  int dataOff;
  unsigned_short M16zeroes [2];
  unsigned_short EOB [2];
  unsigned_short *in_stack_fffffffffffffe68;
  undefined6 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  undefined1 uVar3;
  float in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  int in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  unsigned_short local_170 [2];
  float local_16c;
  int local_168 [64];
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined2 local_48;
  undefined2 local_46;
  undefined2 local_44;
  undefined2 local_42;
  long local_40;
  int local_34;
  long local_30;
  int local_c;
  
  local_44 = *in_stack_00000018;
  local_42 = in_stack_00000018[1];
  local_48 = in_stack_00000018[0x1e0];
  local_46 = in_stack_00000018[0x1e1];
  local_58 = in_R8D << 3;
  local_40 = in_R9;
  local_34 = in_R8D;
  local_30 = in_RCX;
  for (local_4c = 0; local_4c < local_58; local_4c = local_34 + local_4c) {
    stbiw__jpg_DCT((float *)(local_30 + (long)local_4c * 4),
                   (float *)(local_30 + (long)(local_4c + 1) * 4),
                   (float *)(local_30 + (long)(local_4c + 2) * 4),
                   (float *)(local_30 + (long)(local_4c + 3) * 4),
                   (float *)(local_30 + (long)(local_4c + 4) * 4),
                   (float *)(local_30 + (long)(local_4c + 5) * 4),
                   (float *)(local_30 + (long)(local_4c + 6) * 4),
                   (float *)(local_30 + (long)(local_4c + 7) * 4));
  }
  for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
    stbiw__jpg_DCT((float *)(local_30 + (long)local_4c * 4),
                   (float *)(local_30 + (long)(local_4c + local_34) * 4),
                   (float *)(local_30 + (long)(local_4c + local_34 * 2) * 4),
                   (float *)(local_30 + (long)(local_4c + local_34 * 3) * 4),
                   (float *)(local_30 + (long)(local_4c + local_34 * 4) * 4),
                   (float *)(local_30 + (long)(local_4c + local_34 * 5) * 4),
                   (float *)(local_30 + (long)(local_4c + local_34 * 6) * 4),
                   (float *)(local_30 + (long)(local_4c + local_34 * 7) * 4));
  }
  local_54 = 0;
  for (local_68 = 0; local_68 < 8; local_68 = local_68 + 1) {
    for (local_64 = 0; local_64 < 8; local_64 = local_64 + 1) {
      local_50 = local_68 * local_34 + local_64;
      local_16c = *(float *)(local_30 + (long)local_50 * 4) *
                  *(float *)(local_40 + (long)local_54 * 4);
      if (0.0 <= local_16c) {
        in_stack_fffffffffffffe78 = local_16c + 0.5;
      }
      else {
        in_stack_fffffffffffffe78 = local_16c - 0.5;
      }
      local_168[""[local_54]] = (int)in_stack_fffffffffffffe78;
      local_54 = local_54 + 1;
    }
  }
  local_5c = local_168[0] - in_stack_00000008;
  if (local_5c == 0) {
    stbiw__jpg_writeBits
              ((stbi__write_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (int *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               (int *)CONCAT17(in_stack_fffffffffffffe77,
                               CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)),
               in_stack_fffffffffffffe68);
  }
  else {
    stbiw__jpg_calcBits(local_5c,local_170);
    stbiw__jpg_writeBits
              ((stbi__write_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (int *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               (int *)CONCAT17(in_stack_fffffffffffffe77,
                               CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)),
               in_stack_fffffffffffffe68);
    stbiw__jpg_writeBits
              ((stbi__write_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (int *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               (int *)CONCAT17(in_stack_fffffffffffffe77,
                               CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)),
               in_stack_fffffffffffffe68);
  }
  local_60 = 0x3f;
  while( true ) {
    bVar2 = false;
    if (0 < local_60) {
      bVar2 = local_168[local_60] == 0;
    }
    if (!bVar2) break;
    local_60 = local_60 + -1;
  }
  if (local_60 == 0) {
    stbiw__jpg_writeBits
              ((stbi__write_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (int *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               (int *)(ulong)CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68);
    local_c = local_168[0];
  }
  else {
    uVar3 = 0;
    for (local_50 = 1; iVar1 = local_50, local_50 <= local_60; local_50 = local_50 + 1) {
      for (; in_stack_fffffffffffffe76 = local_168[local_50] == 0 && local_50 <= local_60,
          local_168[local_50] == 0 && local_50 <= local_60; local_50 = local_50 + 1) {
      }
      if (0xf < local_50 - iVar1) {
        in_stack_fffffffffffffe80 = local_50 - iVar1 >> 4;
        for (in_stack_fffffffffffffe7c = 1; in_stack_fffffffffffffe7c <= in_stack_fffffffffffffe80;
            in_stack_fffffffffffffe7c = in_stack_fffffffffffffe7c + 1) {
          stbiw__jpg_writeBits
                    ((stbi__write_context *)
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                     (int *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                     (int *)CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe76,
                                                    in_stack_fffffffffffffe70)),
                     in_stack_fffffffffffffe68);
        }
      }
      stbiw__jpg_calcBits(local_168[local_50],(unsigned_short *)&stack0xfffffffffffffe84);
      stbiw__jpg_writeBits
                ((stbi__write_context *)
                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (int *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 (int *)CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)
                                ),in_stack_fffffffffffffe68);
      stbiw__jpg_writeBits
                ((stbi__write_context *)
                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (int *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 (int *)CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)
                                ),in_stack_fffffffffffffe68);
    }
    if (local_60 != 0x3f) {
      stbiw__jpg_writeBits
                ((stbi__write_context *)
                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (int *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 (int *)CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)
                                ),in_stack_fffffffffffffe68);
    }
    local_c = local_168[0];
  }
  return local_c;
}

Assistant:

static int
stbiw__jpg_processDU(stbi__write_context *s, int *bitBuf, int *bitCnt, float *CDU, int du_stride, float *fdtbl, int DC,
                     const unsigned short HTDC[256][2], const unsigned short HTAC[256][2]) {
    const unsigned short EOB[2] = {HTAC[0x00][0], HTAC[0x00][1]};
    const unsigned short M16zeroes[2] = {HTAC[0xF0][0], HTAC[0xF0][1]};
    int dataOff, i, j, n, diff, end0pos, x, y;
    int DU[64];

    // DCT rows
    for (dataOff = 0, n = du_stride * 8; dataOff < n; dataOff += du_stride) {
        stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff + 1], &CDU[dataOff + 2], &CDU[dataOff + 3], &CDU[dataOff + 4],
                       &CDU[dataOff + 5], &CDU[dataOff + 6], &CDU[dataOff + 7]);
    }
    // DCT columns
    for (dataOff = 0; dataOff < 8; ++dataOff) {
        stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff + du_stride], &CDU[dataOff + du_stride * 2],
                       &CDU[dataOff + du_stride * 3], &CDU[dataOff + du_stride * 4],
                       &CDU[dataOff + du_stride * 5], &CDU[dataOff + du_stride * 6], &CDU[dataOff + du_stride * 7]);
    }
    // Quantize/descale/zigzag the coefficients
    for (y = 0, j = 0; y < 8; ++y) {
        for (x = 0; x < 8; ++x, ++j) {
            float v;
            i = y * du_stride + x;
            v = CDU[i] * fdtbl[j];
            // DU[stbiw__jpg_ZigZag[j]] = (int)(v < 0 ? ceilf(v - 0.5f) : floorf(v + 0.5f));
            // ceilf() and floorf() are C99, not C89, but I /think/ they're not needed here anyway?
            DU[stbiw__jpg_ZigZag[j]] = (int) (v < 0 ? v - 0.5f : v + 0.5f);
        }
    }

    // Encode DC
    diff = DU[0] - DC;
    if (diff == 0) {
        stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[0]);
    } else {
        unsigned short bits[2];
        stbiw__jpg_calcBits(diff, bits);
        stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[bits[1]]);
        stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
    }
    // Encode ACs
    end0pos = 63;
    for (; (end0pos > 0) && (DU[end0pos] == 0); --end0pos) {
    }
    // end0pos = first element in reverse order !=0
    if (end0pos == 0) {
        stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
        return DU[0];
    }
    for (i = 1; i <= end0pos; ++i) {
        int startpos = i;
        int nrzeroes;
        unsigned short bits[2];
        for (; DU[i] == 0 && i <= end0pos; ++i) {
        }
        nrzeroes = i - startpos;
        if (nrzeroes >= 16) {
            int lng = nrzeroes >> 4;
            int nrmarker;
            for (nrmarker = 1; nrmarker <= lng; ++nrmarker)
                stbiw__jpg_writeBits(s, bitBuf, bitCnt, M16zeroes);
            nrzeroes &= 15;
        }
        stbiw__jpg_calcBits(DU[i], bits);
        stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTAC[(nrzeroes << 4) + bits[1]]);
        stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
    }
    if (end0pos != 63) {
        stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
    }
    return DU[0];
}